

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

void __thiscall
slang::ast::Expression::findPotentiallyImplicitNets(slang::syntax::SyntaxNode_const&,slang::ast::
ASTContext_const&,slang::SmallVectorBase<slang::syntax::IdentifierNameSyntax_const*>&)::Visitor::
handle(slang::syntax::NameSyntax_const__(void *this,NameSyntax *nameSyntax)

{
  bool bVar1;
  bitmask<slang::ast::LookupFlags> flags;
  IdentifierNameSyntax *local_298;
  ASTContext local_290;
  LookupResult result;
  
  if ((nameSyntax->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName) {
    flags.m_bits = 0x400c;
    if (((ulong)(*this)[2] >> 0x2c & 1) == 0) {
      flags.m_bits = 8;
    }
    result.selectors.
    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    .data_ = (pointer)result.selectors.
                      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                      .firstElement;
    result.found = (Symbol *)0x0;
    result.systemSubroutine._0_5_ = 0;
    result.systemSubroutine._5_3_ = 0;
    result.upwardCount = 0;
    result.flags.m_bits = '\0';
    result.selectors.
    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    .len = 0;
    result.selectors.
    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
    .cap = 4;
    result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
         (pointer)result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                  firstElement;
    result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
    result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
    result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.data_ =
         (pointer)result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                  super_SmallVectorBase<slang::Diagnostic>.firstElement;
    result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.len = 0;
    result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
    super_SmallVectorBase<slang::Diagnostic>.cap = 2;
    local_290.scope.ptr = (Scope *)**this;
    local_290.lookupIndex = 0xffffffff;
    local_290.flags.m_bits = 0;
    local_290.instanceOrProc = (Symbol *)0x0;
    local_290.firstTempVar = (TempVarSymbol *)0x0;
    local_290.randomizeDetails = (RandomizeDetails *)0x0;
    local_290.assertionInstance = (AssertionInstanceDetails *)0x0;
    Lookup::name(nameSyntax,&local_290,flags,&result);
    if (result.found == (Symbol *)0x0) {
      bVar1 = LookupResult::hasError(&result);
      if (!bVar1) {
        local_298 = (IdentifierNameSyntax *)nameSyntax;
        SmallVectorBase<slang::syntax::IdentifierNameSyntax_const*>::
        emplace_back<slang::syntax::IdentifierNameSyntax_const*>
                  (*(SmallVectorBase<slang::syntax::IdentifierNameSyntax_const*> **)((long)this + 8)
                   ,&local_298);
      }
    }
    LookupResult::~LookupResult(&result);
  }
  return;
}

Assistant:

void handle(const NameSyntax& nameSyntax) {
            if (nameSyntax.kind != SyntaxKind::IdentifierName)
                return;

            bitmask<LookupFlags> flags = LookupFlags::NoUndeclaredError;
            if (context.flags.has(ASTFlags::BindInstantiation))
                flags |= LookupFlags::DisallowWildcardImport | LookupFlags::DisallowUnitReferences;

            LookupResult result;
            ASTContext ctx(*context.scope, LookupLocation::max);
            Lookup::name(nameSyntax, ctx, flags, result);

            SLANG_ASSERT(!result.flags.has(LookupResultFlags::IsHierarchical));

            if (!result.found && !result.hasError())
                results.push_back(&nameSyntax.as<IdentifierNameSyntax>());
        }